

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  char *pcVar1;
  string env_var;
  char *in_stack_ffffffffffffffd0;
  
  FlagToEnvVar_abi_cxx11_(in_stack_ffffffffffffffd0);
  pcVar1 = getenv(in_stack_ffffffffffffffd0);
  if ((pcVar1 != (char *)0x0) && (default_value = true, *pcVar1 == '0')) {
    default_value = pcVar1[1] != '\0';
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return default_value;
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
}